

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_creator.cpp
# Opt level: O3

Graph * createPositiveTestGraph(void)

{
  pointer psVar1;
  pointer psVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  type *ptVar6;
  AdjList *g;
  long lVar7;
  Graph *in_RDI;
  long lVar8;
  AdjList *g_1;
  value_type vVar9;
  long lVar10;
  EdgeIterator ei;
  EdgeIterator ei_end;
  undefined8 uStack_1c8;
  undefined1 local_1c0;
  undefined7 uStack_1bf;
  undefined1 uStack_1b8;
  undefined7 uStack_1b7;
  byte bStack_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  pair<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>,_boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,_boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_*,_std::vector<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>_>,_unsigned_long,_boost::detail::edge_desc_impl<boost::directed_tag,_unsigned_long>,_long>,_boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>_>_>
  local_178;
  undefined8 local_e8;
  undefined1 local_e0;
  undefined7 uStack_df;
  undefined1 uStack_d8;
  ulong uStack_d7;
  long local_c8;
  undefined1 *local_98;
  undefined8 *local_90;
  pair<int,_int> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  pair<int,_int> local_38;
  
  local_88.first = 0;
  local_88.second = 3;
  uStack_80 = 0x200000000;
  local_78 = 0x100000000;
  uStack_70 = 1;
  local_68 = 0x300000002;
  uStack_60 = 0x100000002;
  local_58 = 0x100000003;
  uStack_50 = 0x400000003;
  local_48 = 4;
  uStack_40 = 0x200000004;
  boost::
  adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
  ::adjacency_list<std::pair<int,int>*>
            ((adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>
              *)in_RDI,&local_88,&local_38,5,0,(no_property *)&local_178);
  uStack_1b8 = 0;
  uStack_1b7 = 0;
  bStack_1b0 = 0;
  uStack_1c8 = 0;
  local_1c0 = 0;
  uStack_1bf = 0;
  uStack_d8 = 0;
  uStack_d7 = 0;
  local_e8 = 0;
  local_e0 = 0;
  uStack_df = 0;
  psVar1 = (in_RDI->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (in_RDI->super_type).m_vertices.
           super__Vector_base<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex,_std::allocator<boost::detail::adj_list_gen<boost::adjacency_list<boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>,_boost::vecS,_boost::vecS,_boost::directedS,_boost::no_property,_EdgeProperties,_boost::no_property,_boost::listS>::config::stored_vertex>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_178.first.vEnd.m_value = (long)psVar2 - (long)psVar1 >> 5;
  vVar9 = 0;
  if (psVar2 != psVar1) {
    ptVar6 = (type *)&(psVar1->super_StoredVertex).m_out_edges.
                      super__Vector_base<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>,_std::allocator<boost::detail::stored_edge_property<unsigned_long,_EdgeProperties>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
    local_178.first.vCurr.m_value = 0;
    do {
      if (*ptVar6 != (type)((_Vector_impl_data *)(ptVar6 + -1))->_M_start) {
        local_178.first.edges.super_type.m_initialized = true;
        local_178.first.edges.super_type.m_storage.dummy_.aligner_ =
             (type)((_Vector_impl_data *)(ptVar6 + -1))->_M_start;
        local_178.first.edges.super_type.m_storage.dummy_._8_8_ = local_178.first.vCurr.m_value;
        local_178.first.edges.super_type.m_storage.dummy_._16_8_ = *ptVar6;
        local_178.first.edges.super_type.m_storage.dummy_._24_8_ = local_178.first.vCurr.m_value;
        goto LAB_0010da14;
      }
      local_178.first.vCurr.m_value = local_178.first.vCurr.m_value + 1;
      ptVar6 = ptVar6 + 4;
      vVar9 = local_178.first.vEnd.m_value;
    } while (local_178.first.vEnd.m_value != local_178.first.vCurr.m_value);
  }
  local_178.first.edges.super_type.m_initialized = false;
  local_178.first.vCurr.m_value = vVar9;
LAB_0010da14:
  local_178.first.vBegin.m_value = 0;
  local_178.second.vBegin.m_value = 0;
  local_178.second.edges.super_type.m_initialized = false;
  local_90 = &local_e8;
  local_178.second.vCurr.m_value = local_178.first.vEnd.m_value;
  local_178.second.vEnd.m_value = local_178.first.vEnd.m_value;
  local_98 = (undefined1 *)&uStack_1c8;
  boost::tuples::
  tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
  ::operator=((tuple<boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::detail::adj_list_edge_iterator<boost::range_detail::integer_iterator<unsigned_long>,boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>*,std::vector<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>,std::allocator<boost::detail::stored_edge_property<unsigned_long,EdgeProperties>>>>,unsigned_long,boost::detail::edge_desc_impl<boost::directed_tag,unsigned_long>,long>,boost::adjacency_list<boost::vecS,boost::vecS,boost::directedS,boost::no_property,EdgeProperties,boost::no_property,boost::listS>>&,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type,boost::tuples::null_type>
               *)&local_98,&local_178);
  lVar7 = CONCAT71(uStack_1bf,local_1c0);
  lVar5 = CONCAT71(uStack_1b7,uStack_1b8);
  lVar8 = 0;
  do {
    if (lVar7 == CONCAT71(uStack_df,local_e0)) {
      if (CONCAT71(uStack_df,local_e0) == lVar5) {
        return in_RDI;
      }
      if (((bStack_1b0 & 1) == 0) || ((uStack_d7 & 0x100000000000000) == 0)) {
LAB_0010db4f:
        __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c5,
                      "pointer_const_type boost::optional<std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>>::operator->() const [T = std::pair<boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>, boost::detail::out_edge_iter<__gnu_cxx::__normal_iterator<boost::detail::stored_edge_property<unsigned long, EdgeProperties> *, std::vector<boost::detail::stored_edge_property<unsigned long, EdgeProperties>>>, unsigned long, boost::detail::edge_desc_impl<boost::directed_tag, unsigned long>, long>>]"
                     );
      }
      if (local_1a8 == local_c8) {
        return in_RDI;
      }
    }
    else if ((bStack_1b0 & 1) == 0) goto LAB_0010db4f;
    **(undefined4 **)(local_1a8 + 8) = (&DAT_00115de0)[lVar8];
    local_1a8 = local_1a8 + 0x10;
    if (local_1a8 == local_198) {
      lVar10 = lVar7 * 0x20 + 0x28;
      do {
        if (lVar5 + -1 == lVar7) {
          local_1c0 = uStack_1b8;
          uStack_1bf = uStack_1b7;
          lVar7 = lVar5;
          goto LAB_0010db32;
        }
        lVar3 = *(long *)(*(long *)(local_188 + 0x18) + -8 + lVar10);
        lVar4 = *(long *)(*(long *)(local_188 + 0x18) + lVar10);
        lVar10 = lVar10 + 0x20;
        lVar7 = lVar7 + 1;
      } while (lVar4 == lVar3);
      local_1c0 = (undefined1)lVar7;
      uStack_1bf = (undefined7)((ulong)lVar7 >> 8);
      local_1a8 = lVar3;
      local_1a0 = lVar7;
      local_198 = lVar4;
      local_190 = lVar7;
    }
LAB_0010db32:
    lVar8 = lVar8 + 1;
  } while( true );
}

Assistant:

Graph createPositiveTestGraph()
{
    typedef std::pair < int, int >E;
    const int n_edges = 10;

    E edge_array[] = { E(0, 3), E(0, 2), E(0, 1), E(1, 0), E(2, 3), E(2, 1), E(3, 1), E(3, 4), E(4, 0), E(4,2) };
    int weight[n_edges] = { 4, 8, 5, 2, 9, 3, 7, 2, 6, 7 };

    Graph g(edge_array, edge_array + n_edges, 5);

    EdgeIterator ei, ei_end;
    int i = 0;
    for (tie(ei, ei_end) = edges(g); ei != ei_end; ++ei, ++i)
        g[*ei].weight = weight[i];

    return g;
}